

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O0

MESSAGE_QUEUE_HANDLE message_queue_create(MESSAGE_QUEUE_CONFIG *config)

{
  LOGGER_LOG p_Var1;
  SINGLYLINKEDLIST_HANDLE pSVar2;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  MESSAGE_QUEUE *result;
  MESSAGE_QUEUE_CONFIG *config_local;
  
  if (config == (MESSAGE_QUEUE_CONFIG *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"message_queue_create",0x1ca,1,"invalid configuration (NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (config->on_process_message_callback == (PROCESS_MESSAGE_CALLBACK)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"message_queue_create",0x1cf,1,
                "invalid configuration (on_process_message_callback is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0x40);
    if ((MESSAGE_QUEUE_HANDLE)l == (MESSAGE_QUEUE_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                  ,"message_queue_create",0x1d4,1,"failed allocating MESSAGE_QUEUE");
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      memset(l,0,0x40);
      pSVar2 = singlylinkedlist_create();
      ((MESSAGE_QUEUE_HANDLE)l)->pending = pSVar2;
      if (pSVar2 == (SINGLYLINKEDLIST_HANDLE)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                    ,"message_queue_create",0x1de,1,"failed allocating MESSAGE_QUEUE pending list");
        }
        message_queue_destroy((MESSAGE_QUEUE_HANDLE)l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        pSVar2 = singlylinkedlist_create();
        ((MESSAGE_QUEUE_HANDLE)l)->in_progress = pSVar2;
        if (pSVar2 == (SINGLYLINKEDLIST_HANDLE)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                      ,"message_queue_create",0x1e4,1,
                      "failed allocating MESSAGE_QUEUE in-progress list");
          }
          message_queue_destroy((MESSAGE_QUEUE_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          ((MESSAGE_QUEUE_HANDLE)l)->max_message_enqueued_time_secs =
               config->max_message_enqueued_time_secs;
          ((MESSAGE_QUEUE_HANDLE)l)->max_message_processing_time_secs =
               config->max_message_processing_time_secs;
          ((MESSAGE_QUEUE_HANDLE)l)->max_retry_count = config->max_retry_count;
          ((MESSAGE_QUEUE_HANDLE)l)->on_process_message_callback =
               config->on_process_message_callback;
        }
      }
    }
  }
  return (MESSAGE_QUEUE_HANDLE)l;
}

Assistant:

MESSAGE_QUEUE_HANDLE message_queue_create(MESSAGE_QUEUE_CONFIG* config)
{
    MESSAGE_QUEUE* result;

    if (config == NULL)
    {
        LogError("invalid configuration (NULL)");
        result = NULL;
    }
    else if (config->on_process_message_callback == NULL)
    {
        LogError("invalid configuration (on_process_message_callback is NULL)");
        result = NULL;
    }
    else if ((result = (MESSAGE_QUEUE*)malloc(sizeof(MESSAGE_QUEUE))) == NULL)
    {
        LogError("failed allocating MESSAGE_QUEUE");
        result = NULL;
    }
    else
    {
        // Here it already sets the id_counter to zero.
        memset(result, 0, sizeof(MESSAGE_QUEUE));

        if ((result->pending = singlylinkedlist_create()) == NULL)
        {
            LogError("failed allocating MESSAGE_QUEUE pending list");
            message_queue_destroy(result);
            result = NULL;
        }
        else if ((result->in_progress = singlylinkedlist_create()) == NULL)
        {
            LogError("failed allocating MESSAGE_QUEUE in-progress list");
            message_queue_destroy(result);
            result = NULL;
        }
        else
        {

            result->max_message_enqueued_time_secs = config->max_message_enqueued_time_secs;
            result->max_message_processing_time_secs = config->max_message_processing_time_secs;
            result->max_retry_count = config->max_retry_count;
            result->on_process_message_callback = config->on_process_message_callback;
        }
    }

    return result;
}